

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_feature_tweaks(options_i *options,vw *all)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *location;
  vw_ostream *pvVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t i_3;
  option_group_definition *poVar7;
  typed_option<unsigned_int> *ptVar8;
  hash_func_t p_Var9;
  long lVar10;
  ostream *poVar11;
  byte *pbVar12;
  char *pcVar13;
  vw_exception *pvVar14;
  byte *pbVar15;
  size_type sVar16;
  byte bVar17;
  size_t i;
  long lVar18;
  char cVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore;
  ulong uVar21;
  pointer pbVar22;
  pointer pbVar23;
  uchar uVar24;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_2;
  pointer pbVar25;
  bool bVar26;
  bool leave_duplicate_interactions;
  bool noconstant;
  vw *local_25f0;
  allocator local_25e7;
  allocator local_25e6;
  allocator local_25e5;
  allocator local_25e4;
  allocator local_25e3;
  allocator local_25e2;
  allocator local_25e1;
  allocator local_25e0;
  allocator local_25df;
  allocator local_25de;
  allocator local_25dd;
  allocator local_25dc;
  allocator local_25db;
  allocator local_25da;
  allocator local_25d9;
  allocator local_25d8;
  allocator local_25d7;
  allocator local_25d6;
  allocator local_25d5;
  allocator local_25d4;
  allocator local_25d3;
  allocator local_25d2;
  allocator local_25d1;
  allocator local_25d0;
  allocator local_25cf;
  allocator local_25ce;
  allocator local_25cd;
  allocator local_25cc;
  allocator local_25cb;
  allocator local_25ca;
  allocator local_25c9;
  allocator local_25c8;
  allocator local_25c7;
  allocator local_25c6;
  allocator local_25c5;
  allocator local_25c4;
  allocator local_25c3;
  allocator local_25c2;
  allocator local_25c1;
  allocator local_25c0;
  allocator local_25bf;
  allocator local_25be;
  allocator local_25bd;
  allocator local_25bc;
  allocator local_25bb;
  allocator local_25ba;
  allocator local_25b9;
  pointer local_25b8;
  uint32_t new_bits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignore_linears;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spelling_ns;
  stringstream __msg;
  _Alloc_hider local_2528;
  undefined1 local_2520 [96];
  bool local_24c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_cubic;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interactions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cubics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  quadratics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_nses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  redefines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2220;
  string affix;
  string hash_function;
  string local_21c8;
  string local_21a8 [32];
  string local_2188;
  string local_2168 [32];
  string local_2148;
  string local_2128 [32];
  string local_2108 [32];
  string local_20e8;
  string local_20c8 [32];
  string local_20a8;
  string local_2088 [32];
  string local_2068;
  string local_2048 [32];
  string local_2028;
  string local_2008 [32];
  string local_1fe8;
  string local_1fc8 [32];
  string local_1fa8;
  string local_1f88 [32];
  string local_1f68;
  string local_1f48 [32];
  string local_1f28;
  string local_1f08 [32];
  string local_1ee8;
  string local_1ec8 [32];
  string local_1ea8;
  string local_1e88 [32];
  string local_1e68;
  string local_1e48 [32];
  string local_1e28 [32];
  string local_1e08;
  string local_1de8 [32];
  string local_1dc8;
  string local_1da8 [32];
  string local_1d88 [32];
  string local_1d68;
  string local_1d48 [32];
  string local_1d28;
  string local_1d08 [32];
  string local_1ce8;
  string local_1cc8 [32];
  string local_1ca8;
  string local_1c88 [32];
  string local_1c68;
  string local_1c48 [32];
  string local_1c28;
  string local_1c08 [32];
  string local_1be8;
  string local_1bc8;
  string q_colon;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_interactions;
  string local_1b58 [64];
  bool local_1b18;
  string local_1ae8;
  string local_1ac8;
  string local_1aa8;
  string local_1a88;
  option_group_definition feature_options;
  undefined1 local_1a30 [112];
  bool local_19c0;
  string local_1990;
  string local_1970;
  undefined1 local_1950 [80];
  string local_1900 [32];
  bool local_18e0;
  undefined1 local_18b0 [80];
  string local_1860 [80];
  undefined1 local_1810 [112];
  bool local_17a0;
  undefined1 local_1770 [112];
  bool local_1700;
  undefined1 local_16d0 [112];
  bool local_1660;
  undefined1 local_1630 [112];
  bool local_15c0;
  undefined1 local_1590 [112];
  bool local_1520;
  undefined1 local_14f0 [112];
  bool local_1480;
  undefined1 local_1450 [112];
  bool local_13e0;
  undefined1 local_13b0 [80];
  string local_1360 [80];
  string local_1310;
  undefined1 local_12f0 [160];
  undefined1 local_1250 [160];
  undefined1 local_11b0 [160];
  undefined1 local_1110 [160];
  undefined1 local_1070 [160];
  undefined1 local_fd0 [160];
  undefined1 local_f30 [160];
  undefined1 local_e90 [160];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_df0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d50;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cb0;
  typed_option<bool> local_c10;
  typed_option<bool> local_b70;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ad0;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a30;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_990;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7b0;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_710;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_670;
  typed_option<float> local_5d0;
  typed_option<bool> local_530;
  typed_option<unsigned_int> local_490;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  typed_option<unsigned_int> local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  std::__cxx11::string::string((string *)&hash_function,"strings",(allocator *)&__msg);
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  affix._M_dataplus._M_p = (pointer)&affix.field_2;
  affix._M_string_length = 0;
  affix.field_2._M_local_buf[0] = '\0';
  q_colon._M_dataplus._M_p = (pointer)&q_colon.field_2;
  q_colon._M_string_length = 0;
  q_colon.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1bc8,"Feature options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&feature_options,&local_1bc8);
  std::__cxx11::string::~string((string *)&local_1bc8);
  std::__cxx11::string::string((string *)&local_1be8,"hash",&local_25b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_1be8,&hash_function);
  local_24c0 = true;
  std::__cxx11::string::string
            (local_1c08,"how to hash the features. Available options: strings, all",&local_25ba);
  std::__cxx11::string::_M_assign((string *)(local_2520 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>
                     (&feature_options,&local_d0);
  std::__cxx11::string::string((string *)&local_1c28,"hash_seed",&local_25bb);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&exp_cubic,&local_1c28,&all->hash_seed);
  ptVar8 = VW::config::typed_option<unsigned_int>::default_value
                     ((typed_option<unsigned_int> *)&exp_cubic,0);
  std::__cxx11::string::string(local_1c48,"seed for hash function",&local_25bc);
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_170,ptVar8);
  poVar7 = VW::config::option_group_definition::add<unsigned_int>(poVar7,&local_170);
  std::__cxx11::string::string((string *)&local_1c68,"ignore",&local_25bd);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1a30,&local_1c68,&ignores);
  local_19c0 = true;
  std::__cxx11::string::string
            (local_1c88,"ignore namespaces beginning with character <arg>",&local_25be);
  std::__cxx11::string::_M_assign((string *)(local_1a30 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_210,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1a30);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_210);
  std::__cxx11::string::string((string *)&local_1ca8,"ignore_linear",&local_25bf);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&expanded_interactions,&local_1ca8,&ignore_linears);
  local_1b18 = true;
  std::__cxx11::string::string
            (local_1cc8,"ignore namespaces beginning with character <arg> for linear terms only",
             &local_25c0);
  std::__cxx11::string::_M_assign(local_1b58);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_2b0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&expanded_interactions);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_2b0);
  std::__cxx11::string::string((string *)&local_1ce8,"keep",&local_25c1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1770,&local_1ce8,&keeps);
  local_1700 = true;
  std::__cxx11::string::string
            (local_1d08,"keep namespaces beginning with character <arg>",&local_25c2);
  std::__cxx11::string::_M_assign((string *)(local_1770 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_350,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1770);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_350);
  std::__cxx11::string::string((string *)&local_1d28,"redefine",&local_25c3);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1810,&local_1d28,&redefines);
  local_17a0 = true;
  std::__cxx11::string::string
            (local_1d48,
             "redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form \'N:=S\' where := is operator. Empty N or S are treated as default namespace. Use \':\' as a wildcard in S."
             ,&local_25c4);
  std::__cxx11::string::_M_assign((string *)(local_1810 + 0x30));
  local_17a0 = true;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_3f0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1810);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_3f0);
  std::__cxx11::string::string((string *)&local_1d68,"bit_precision",&local_25c5);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_18b0,&local_1d68,&new_bits);
  std::__cxx11::string::string(local_1d88,"b",&local_25c6);
  std::__cxx11::string::_M_assign(local_1860);
  std::__cxx11::string::string(local_1da8,"number of bits in the feature table",&local_25c7);
  std::__cxx11::string::_M_assign((string *)(local_18b0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_490,(typed_option<unsigned_int> *)local_18b0);
  poVar7 = VW::config::option_group_definition::add<unsigned_int>(poVar7,&local_490);
  std::__cxx11::string::string((string *)&local_1dc8,"noconstant",&local_25c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_e90,&local_1dc8,&noconstant);
  std::__cxx11::string::string(local_1de8,"Don\'t add a constant feature",&local_25c9);
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_e90);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_530);
  std::__cxx11::string::string((string *)&local_1e08,"constant",&local_25ca);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_13b0,&local_1e08,&all->initial_constant);
  std::__cxx11::string::string(local_1e28,"C",&local_25cb);
  std::__cxx11::string::_M_assign(local_1360);
  std::__cxx11::string::string(local_1e48,"Set initial value of constant",&local_25cc);
  std::__cxx11::string::_M_assign((string *)(local_13b0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_5d0,(typed_option<float> *)local_13b0);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_5d0);
  std::__cxx11::string::string((string *)&local_1e68,"ngram",&local_25cd);
  pvVar20 = &all->ngram_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_f30,&local_1e68,pvVar20);
  std::__cxx11::string::string
            (local_1e88,
             "Generate N grams. To generate N grams for a single namespace \'foo\', arg should be fN."
             ,&local_25ce);
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_670,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_f30);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_670);
  std::__cxx11::string::string((string *)&local_1ea8,"skips",&local_25cf);
  location = &all->skip_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_fd0,&local_1ea8,location);
  std::__cxx11::string::string
            (local_1ec8,
             "Generate skips in N grams. This in conjunction with the ngram tag can be used to generate generalized n-skip-k-gram. To generate n-skips for a single namespace \'foo\', arg should be fN."
             ,&local_25d0);
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_710,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_fd0);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_710);
  std::__cxx11::string::string((string *)&local_1ee8,"feature_limit",&local_25d1);
  local_25f0 = (vw *)&all->limit_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1070,&local_1ee8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_25f0);
  std::__cxx11::string::string
            (local_1f08,
             "limit to N features. To apply to a single namespace \'foo\', arg should be fN",
             &local_25d2);
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_7b0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1070);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_7b0);
  std::__cxx11::string::string((string *)&local_1f28,"affix",&local_25d3);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1450,&local_1f28,&affix);
  local_13e0 = true;
  std::__cxx11::string::string
            (local_1f48,
             "generate prefixes/suffixes of features; argument \'+2a,-3b,+1\' means generate 2-char prefixes for namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"
             ,&local_25d4);
  std::__cxx11::string::_M_assign((string *)(local_1450 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_850,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1450);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_850);
  std::__cxx11::string::string((string *)&local_1f68,"spelling",&local_25d5);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_14f0,&local_1f68,&spelling_ns);
  local_1480 = true;
  std::__cxx11::string::string
            (local_1f88,
             "compute spelling features for a give namespace (use \'_\' for default namespace)",
             &local_25d6);
  std::__cxx11::string::_M_assign((string *)(local_14f0 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_8f0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_14f0);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_8f0);
  std::__cxx11::string::string((string *)&local_1fa8,"dictionary",&local_25d7);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1590,&local_1fa8,&dictionary_nses);
  local_1520 = true;
  std::__cxx11::string::string
            (local_1fc8,
             "read a dictionary for additional features (arg either \'x:file\' or just \'file\')",
             &local_25d8);
  std::__cxx11::string::_M_assign((string *)(local_1590 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_990,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1590);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_990);
  std::__cxx11::string::string((string *)&local_1fe8,"dictionary_path",&local_25d9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1110,&local_1fe8,&dictionary_path);
  std::__cxx11::string::string
            (local_2008,
             "look in this directory for dictionaries; defaults to current directory or env{PATH}",
             &local_25da);
  std::__cxx11::string::_M_assign((string *)(local_1110 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_a30,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1110);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_a30);
  std::__cxx11::string::string((string *)&local_2028,"interactions",&local_25db);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1630,&local_2028,&interactions);
  local_15c0 = true;
  std::__cxx11::string::string
            (local_2048,"Create feature interactions of any level between namespaces.",&local_25dc);
  std::__cxx11::string::_M_assign((string *)(local_1630 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_ad0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1630);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_ad0);
  std::__cxx11::string::string((string *)&local_2068,"permutations",&local_25dd);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_11b0,&local_2068,&all->permutations);
  std::__cxx11::string::string
            (local_2088,
             "Use permutations instead of combinations for feature interactions of same namespace.",
             &local_25de);
  std::__cxx11::string::_M_assign((string *)(local_11b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_b70,(typed_option<bool> *)local_11b0);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_b70);
  std::__cxx11::string::string((string *)&local_20a8,"leave_duplicate_interactions",&local_25df);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1250,&local_20a8,&leave_duplicate_interactions);
  std::__cxx11::string::string
            (local_20c8,
             "Don\'t remove interactions with duplicate combinations of namespaces. For ex. this is a duplicate: \'-q ab -q ba\' and a lot more in \'-q ::\'."
             ,&local_25e0);
  std::__cxx11::string::_M_assign((string *)(local_1250 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c10,(typed_option<bool> *)local_1250);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_c10);
  std::__cxx11::string::string((string *)&local_20e8,"quadratic",&local_25e1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1950,&local_20e8,&quadratics);
  std::__cxx11::string::string(local_2108,"q",&local_25e2);
  std::__cxx11::string::_M_assign(local_1900);
  local_18e0 = true;
  std::__cxx11::string::string(local_2128,"Create and use quadratic features",&local_25e3);
  std::__cxx11::string::_M_assign((string *)(local_1950 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_cb0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1950);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_cb0);
  std::__cxx11::string::string((string *)&local_2148,"q:",&local_25e4);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_12f0,&local_2148,&q_colon);
  std::__cxx11::string::string
            (local_2168,": corresponds to a wildcard for all printable characters",&local_25e5);
  std::__cxx11::string::_M_assign((string *)(local_12f0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d50,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_12f0);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_d50);
  std::__cxx11::string::string((string *)&local_2188,"cubic",&local_25e6);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_16d0,&local_2188,&cubics);
  local_1660 = true;
  std::__cxx11::string::string(local_21a8,"Create and use cubic features",&local_25e7);
  std::__cxx11::string::_M_assign((string *)(local_16d0 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_df0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_16d0);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(poVar7,&local_df0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_df0);
  std::__cxx11::string::~string(local_21a8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_16d0);
  std::__cxx11::string::~string((string *)&local_2188);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_d50);
  std::__cxx11::string::~string(local_2168);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_12f0);
  std::__cxx11::string::~string((string *)&local_2148);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_cb0);
  std::__cxx11::string::~string(local_2128);
  std::__cxx11::string::~string(local_2108);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1950);
  std::__cxx11::string::~string((string *)&local_20e8);
  VW::config::typed_option<bool>::~typed_option(&local_c10);
  std::__cxx11::string::~string(local_20c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1250);
  std::__cxx11::string::~string((string *)&local_20a8);
  VW::config::typed_option<bool>::~typed_option(&local_b70);
  std::__cxx11::string::~string(local_2088);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_11b0);
  std::__cxx11::string::~string((string *)&local_2068);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_ad0);
  std::__cxx11::string::~string(local_2048);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1630);
  std::__cxx11::string::~string((string *)&local_2028);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_a30);
  std::__cxx11::string::~string(local_2008);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1110);
  std::__cxx11::string::~string((string *)&local_1fe8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_990);
  std::__cxx11::string::~string(local_1fc8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1590);
  std::__cxx11::string::~string((string *)&local_1fa8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_8f0);
  std::__cxx11::string::~string(local_1f88);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_14f0);
  std::__cxx11::string::~string((string *)&local_1f68);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_850);
  std::__cxx11::string::~string(local_1f48);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1450);
  std::__cxx11::string::~string((string *)&local_1f28);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_7b0);
  std::__cxx11::string::~string(local_1f08);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1070);
  std::__cxx11::string::~string((string *)&local_1ee8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_710);
  std::__cxx11::string::~string(local_1ec8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_fd0);
  std::__cxx11::string::~string((string *)&local_1ea8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_670);
  std::__cxx11::string::~string(local_1e88);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_f30);
  std::__cxx11::string::~string((string *)&local_1e68);
  VW::config::typed_option<float>::~typed_option(&local_5d0);
  std::__cxx11::string::~string(local_1e48);
  std::__cxx11::string::~string(local_1e28);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_13b0);
  std::__cxx11::string::~string((string *)&local_1e08);
  VW::config::typed_option<bool>::~typed_option(&local_530);
  std::__cxx11::string::~string(local_1de8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_e90);
  std::__cxx11::string::~string((string *)&local_1dc8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_490);
  std::__cxx11::string::~string(local_1da8);
  std::__cxx11::string::~string(local_1d88);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_18b0);
  std::__cxx11::string::~string((string *)&local_1d68);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_3f0);
  std::__cxx11::string::~string(local_1d48);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1810);
  std::__cxx11::string::~string((string *)&local_1d28);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_350);
  std::__cxx11::string::~string(local_1d08);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1770);
  std::__cxx11::string::~string((string *)&local_1ce8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_1cc8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&expanded_interactions);
  std::__cxx11::string::~string((string *)&local_1ca8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_210);
  std::__cxx11::string::~string(local_1c88);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a30);
  std::__cxx11::string::~string((string *)&local_1c68);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_1c48);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&exp_cubic);
  std::__cxx11::string::~string((string *)&local_1c28);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_d0);
  std::__cxx11::string::~string(local_1c08);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_1be8);
  (**options->_vptr_options_i)(options,&feature_options);
  p_Var9 = getHasher(&hash_function);
  all->p->hasher = p_Var9;
  std::__cxx11::string::string((string *)&__msg,"spelling",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    lVar18 = 0;
    for (uVar21 = 0;
        uVar21 < (ulong)((long)spelling_ns.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)spelling_ns.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar21 = uVar21 + 1)
    {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,
                 (string *)
                 ((long)&((spelling_ns.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((spelling_ns.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar10 = (long)**(char **)((long)&((spelling_ns.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar18);
      if (lVar10 == 0x5f) {
        all->spelling_features[0x20] = true;
      }
      else {
        all->spelling_features[lVar10] = true;
      }
      lVar18 = lVar18 + 0x20;
    }
  }
  std::__cxx11::string::string((string *)&__msg,"affix",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    spoof_hex_encoded_namespaces(&local_21c8,&affix);
    parse_affix_argument(all,&local_21c8);
    std::__cxx11::string::~string((string *)&local_21c8);
  }
  std::__cxx11::string::string((string *)&__msg,"ngram",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::__cxx11::string::string((string *)&__msg,"sort_features",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_2520,"ngram is incompatible with sort_features.");
      pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar14,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2a7,&local_1a88);
      __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar18 = 0;
    for (uVar21 = 0;
        pbVar22 = (all->ngram_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar21 < (ulong)((long)(all->ngram_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22 >> 5);
        uVar21 = uVar21 + 1) {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,(string *)((long)&(pbVar22->_M_dataplus)._M_p + lVar18));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((pvVar20->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar18 = lVar18 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2220,pvVar20);
    compile_gram(&local_2220,all->ngram,"grams",all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2220);
  }
  std::__cxx11::string::string((string *)&__msg,"skips",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::__cxx11::string::string((string *)&__msg,"ngram",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_2520,"You can not skip unless ngram is > 1");
      pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar14,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2b1,&local_1aa8);
      __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar18 = 0;
    for (uVar21 = 0;
        pbVar22 = (all->skip_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar21 < (ulong)((long)(all->skip_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22 >> 5);
        uVar21 = uVar21 + 1) {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,(string *)((long)&(pbVar22->_M_dataplus)._M_p + lVar18));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((location->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar18 = lVar18 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2238,location);
    compile_gram(&local_2238,all->skips,"skips",all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2238);
  }
  std::__cxx11::string::string((string *)&__msg,"feature_limit",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2250,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_25f0);
    compile_limits(&local_2250,all->limit,all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2250);
  }
  std::__cxx11::string::string((string *)&__msg,"bit_precision",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  local_25f0 = all;
  if ((char)iVar6 != '\0') {
    if ((all->default_bits == false) && (new_bits != all->num_bits)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar11 = std::operator<<((ostream *)local_2520,"Number of bits is set to ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11," and ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::operator<<(poVar11," by argument and model.  That does not work.");
      pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar14,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2bf,&local_1ac8);
      __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->default_bits = false;
    all->num_bits = new_bits;
    VW::validate_num_bits(all);
  }
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((all->pairs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (all->pairs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((all->triples).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (all->triples).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (bVar17 = interactions_settings_doubled,
     (all->interactions).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start ==
     (all->interactions).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
joined_r0x00132679:
    if (bVar17 == 0) goto LAB_001317cd;
  }
  else {
    std::__cxx11::string::string((string *)&__msg,"quadratic",(allocator *)local_1770);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::string::string((string *)&exp_cubic,"cubic",(allocator *)local_1810);
      iVar6 = (*options->_vptr_options_i[1])(options,&exp_cubic);
      if ((char)iVar6 == '\0') {
        std::__cxx11::string::string((string *)local_1a30,"interactions",(allocator *)local_18b0);
        iVar6 = (*options->_vptr_options_i[1])(options,local_1a30);
        bVar17 = (byte)iVar6 | interactions_settings_doubled;
        std::__cxx11::string::~string((string *)local_1a30);
        std::__cxx11::string::~string((string *)&exp_cubic);
        std::__cxx11::string::~string((string *)&__msg);
        bVar17 = bVar17 & 1;
        goto joined_r0x00132679;
      }
      std::__cxx11::string::~string((string *)&exp_cubic);
    }
    std::__cxx11::string::~string((string *)&__msg);
  }
  poVar11 = std::operator<<(&(all->trace_message).super_ostream,
                            "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they\'ll be OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                           );
  std::endl<char,std::char_traits<char>>(poVar11);
  if ((all->pairs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->pairs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->pairs);
  }
  if ((all->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->triples);
  }
  if ((all->interactions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->interactions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->interactions);
  }
LAB_001317cd:
  std::__cxx11::string::string((string *)&__msg,"quadratic",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,"creating quadratic features for pairs: ")
      ;
    }
    for (pbVar22 = quadratics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        quadratics.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar11 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar22);
        std::operator<<(poVar11," ");
      }
    }
    std::__cxx11::string::string
              ((string *)&__msg,"error, quadratic features must involve two sets.",
               (allocator *)local_1a30);
    INTERACTIONS::expand_interactions(&exp_cubic,&quadratics,2,(string *)&__msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&expanded_interactions,&exp_cubic);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
    std::__cxx11::string::~string((string *)&__msg);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"cubic",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,"creating cubic features for triples: ");
    }
    for (pbVar22 = cubics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        cubics.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar11 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar22);
        std::operator<<(poVar11," ");
      }
    }
    std::__cxx11::string::string
              ((string *)&__msg,"error, cubic features must involve three sets.",
               (allocator *)local_1a30);
    INTERACTIONS::expand_interactions(&exp_cubic,&cubics,3,(string *)&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &expanded_interactions,
               (const_iterator)
               expanded_interactions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
  }
  std::__cxx11::string::string((string *)&__msg,"interactions",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,
                      "creating features for following interactions: ");
    }
    for (pbVar22 = interactions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        interactions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar11 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar22);
        std::operator<<(poVar11," ");
      }
    }
    std::__cxx11::string::string((string *)&__msg,"",(allocator *)local_1a30);
    INTERACTIONS::expand_interactions(&exp_cubic,&interactions,0,(string *)&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &expanded_interactions,
               (const_iterator)
               expanded_interactions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
  }
  if (expanded_interactions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      expanded_interactions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    INTERACTIONS::sort_and_filter_duplicate_interactions
              (&expanded_interactions,(bool)(leave_duplicate_interactions ^ 1),(size_t *)&__msg,
               (size_t *)&exp_cubic);
    if ((_func_int **)___msg != (_func_int **)0x0) {
      poVar11 = std::operator<<(&(all->trace_message).super_ostream,
                                "WARNING: duplicate namespace interactions were found. Removed: ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,'.');
      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = std::operator<<(poVar11,
                                "You can use --leave_duplicate_interactions to disable this behaviour."
                               );
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    if (exp_cubic.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      poVar11 = std::operator<<(&(all->trace_message).super_ostream,
                                "WARNING: some interactions contain duplicate characters and their characters order has been changed. Interactions affected: "
                               );
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,'.');
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    if ((all->interactions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (all->interactions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&all->interactions);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&all->interactions,&expanded_interactions);
    pbVar22 = expanded_interactions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar25 = expanded_interactions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar25 != pbVar22;
        pbVar25 = pbVar25 + 1) {
      pvVar20 = &all->triples;
      if ((pbVar25->_M_string_length == 3) ||
         (pvVar20 = &all->pairs, pbVar25->_M_string_length == 2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar20,pbVar25);
      }
    }
  }
  for (lVar18 = 0x3b1; lVar18 != 0x4b1; lVar18 = lVar18 + 1) {
    *(undefined1 *)((long)&all->sd + lVar18) = 0;
    (&(all->trace_message).super_ostream.field_0x21)[lVar18] = 0;
  }
  all->ignore_some = false;
  all->ignore_some_linear = false;
  std::__cxx11::string::string((string *)&__msg,"ignore",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    all->ignore_some = true;
    for (pbVar22 = ignores.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        ignores.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar12 = (byte *)(pbVar22->_M_dataplus)._M_p;
      pbVar15 = pbVar12;
      for (; pbVar12 != pbVar15 + pbVar22->_M_string_length; pbVar12 = pbVar12 + 1) {
        all->ignore[*pbVar12] = true;
        pbVar15 = (byte *)(pbVar22->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"ignoring namespaces beginning with: ");
      local_25b8 = ignores.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar22 = ignores.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar22 != local_25b8;
          pbVar22 = pbVar22 + 1) {
        pcVar2 = (pbVar22->_M_dataplus)._M_p;
        sVar3 = pbVar22->_M_string_length;
        for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
          poVar11 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar16]);
          std::operator<<(poVar11," ");
        }
        all = local_25f0;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"ignore_linear",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    all->ignore_some_linear = true;
    for (pbVar22 = ignore_linears.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        ignore_linears.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar12 = (byte *)(pbVar22->_M_dataplus)._M_p;
      pbVar15 = pbVar12;
      for (; pbVar12 != pbVar15 + pbVar22->_M_string_length; pbVar12 = pbVar12 + 1) {
        all->ignore_linear[*pbVar12] = true;
        pbVar15 = (byte *)(pbVar22->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"ignoring linear terms for namespaces beginning with: "
                     );
      local_25b8 = ignore_linears.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar22 = ignore_linears.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar22 != local_25b8;
          pbVar22 = pbVar22 + 1) {
        pcVar2 = (pbVar22->_M_dataplus)._M_p;
        sVar3 = pbVar22->_M_string_length;
        for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
          poVar11 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar16]);
          std::operator<<(poVar11," ");
        }
        all = local_25f0;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"keep",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
      all->ignore[lVar18] = true;
    }
    all->ignore_some = true;
    for (pbVar22 = keeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 !=
        keeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar22);
      std::__cxx11::string::operator=((string *)pbVar22,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar12 = (byte *)(pbVar22->_M_dataplus)._M_p;
      pbVar15 = pbVar12;
      for (; pbVar12 != pbVar15 + pbVar22->_M_string_length; pbVar12 = pbVar12 + 1) {
        all->ignore[*pbVar12] = false;
        pbVar15 = (byte *)(pbVar22->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"using namespaces beginning with: ");
      local_25b8 = keeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar22 = keeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar22 != local_25b8;
          pbVar22 = pbVar22 + 1) {
        pcVar2 = (pbVar22->_M_dataplus)._M_p;
        sVar3 = pbVar22->_M_string_length;
        for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
          poVar11 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar16]);
          std::operator<<(poVar11," ");
        }
        all = local_25f0;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  all->redefine_some = false;
  std::__cxx11::string::string((string *)&__msg,"redefine",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 == '\0') {
LAB_00132283:
    std::__cxx11::string::string((string *)&__msg,"dictionary",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 != '\0') {
      std::__cxx11::string::string((string *)&__msg,"dictionary_path",(allocator *)&exp_cubic);
      iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar22 = dictionary_path.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar6 != '\0') {
        local_25f0 = (vw *)&all->dictionary_path;
        for (pbVar25 = dictionary_path.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar25 != pbVar22;
            pbVar25 = pbVar25 + 1) {
          std::__cxx11::string::string((string *)&__msg,(string *)pbVar25);
          std::__cxx11::string::string((string *)&local_1310,(string *)&__msg);
          bVar5 = directory_exists(&local_1310);
          std::__cxx11::string::~string((string *)&local_1310);
          if (bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_25f0,(value_type *)&__msg);
          }
          std::__cxx11::string::~string((string *)&__msg);
        }
      }
      std::__cxx11::string::string((string *)&local_1970,".",(allocator *)&__msg);
      bVar5 = directory_exists(&local_1970);
      std::__cxx11::string::~string((string *)&local_1970);
      if (bVar5) {
        std::__cxx11::string::string((string *)&__msg,".",(allocator *)&exp_cubic);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &all->dictionary_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__msg);
        std::__cxx11::string::~string((string *)&__msg);
      }
      pcVar13 = getenv("PATH");
      std::__cxx11::string::string((string *)&__msg,pcVar13,(allocator *)&exp_cubic);
      if (local_2528._M_p != (pointer)0x0) {
        cVar19 = (char)&__msg;
        lVar18 = std::__cxx11::string::find(cVar19,0x3a);
        while (lVar18 != -1) {
          std::__cxx11::string::substr((ulong)&exp_cubic,(ulong)&__msg);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &all->dictionary_path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_cubic
                    );
          std::__cxx11::string::~string((string *)&exp_cubic);
          lVar18 = std::__cxx11::string::find(cVar19,0x3a);
        }
        std::__cxx11::string::substr((ulong)&exp_cubic,(ulong)&__msg);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &all->dictionary_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_cubic);
        std::__cxx11::string::~string((string *)&exp_cubic);
      }
      lVar18 = 0;
      for (uVar21 = 0;
          uVar21 < (ulong)((long)dictionary_nses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)dictionary_nses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar21 = uVar21 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_1990,
                   (string *)
                   ((long)&((dictionary_nses.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18)
                  );
        parse_dictionary_argument(all,&local_1990);
        std::__cxx11::string::~string((string *)&local_1990);
        lVar18 = lVar18 + 0x20;
      }
      std::__cxx11::string::~string((string *)&__msg);
    }
    if (noconstant == true) {
      all->add_constant = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expanded_interactions);
    VW::config::option_group_definition::~option_group_definition(&feature_options);
    std::__cxx11::string::~string((string *)&q_colon);
    std::__cxx11::string::~string((string *)&affix);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dictionary_path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dictionary_nses);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&redefines);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&keeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignore_linears);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignores);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&interactions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cubics);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&quadratics);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&spelling_ns);
    std::__cxx11::string::~string((string *)&hash_function);
    return;
  }
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
    all->redefine[lVar18] = (uchar)lVar18;
  }
  local_25f0 = (vw *)&all->trace_message;
  pbVar22 = redefines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_0013214b:
  if (pbVar22 !=
      redefines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    spoof_hex_encoded_namespaces((string *)&exp_cubic,pbVar22);
    pbVar25 = exp_cubic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = false;
    lVar18 = 0;
LAB_0013217f:
    lVar10 = 0;
    pbVar23 = exp_cubic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (lVar18 - (long)exp_cubic.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish == lVar10) {
        uVar24 = ' ';
        if (!bVar5) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<((ostream *)local_2520,
                          "argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");
          pvVar14 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar14,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                     ,0x3a4,&local_1ae8);
          __cxa_throw(pvVar14,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
LAB_001321de:
        pbVar23 = (pointer)(lVar18 + 1);
        if ((pointer)0x3 < pbVar23) {
          poVar11 = std::operator<<((ostream *)local_25f0,
                                    "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one (\'"
                                   );
          poVar11 = std::operator<<(poVar11,uVar24);
          poVar11 = std::operator<<(poVar11,"\') will be used as target namespace.");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        all->redefine_some = true;
        if (pbVar23 != pbVar25) goto LAB_0013224f;
        all->redefine[0x20] = uVar24;
        goto LAB_0013222e;
      }
      if (bVar5) {
        uVar24 = ' ';
        if (2 < (ulong)(lVar18 - lVar10)) {
          uVar24 = *(uchar *)&((exp_cubic.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        }
        goto LAB_001321de;
      }
      cVar19 = *(char *)((long)&(pbVar23->_M_dataplus)._M_p + lVar18);
      if (cVar19 == ':') goto LAB_001321b7;
      bVar26 = lVar10 == 0;
      lVar10 = lVar10 + -1;
      bVar4 = bVar5;
      if (bVar26) {
        bVar4 = true;
      }
      if (cVar19 != '=') {
        bVar4 = bVar5;
      }
      bVar5 = bVar4;
      pbVar23 = (pointer)((long)&(pbVar23->_M_dataplus)._M_p + 1);
    } while( true );
  }
  goto LAB_00132283;
LAB_0013224f:
  if (pbVar25 <= pbVar23) goto LAB_0013222e;
  uVar21 = (ulong)*(byte *)((long)&((exp_cubic.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           (long)pbVar23);
  if (uVar21 != 0x3a) {
    all->redefine[uVar21] = uVar24;
    pbVar23 = (pointer)((long)&(pbVar23->_M_dataplus)._M_p + 1);
    goto LAB_0013224f;
  }
  for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
    all->redefine[lVar18] = uVar24;
  }
LAB_0013222e:
  std::__cxx11::string::~string((string *)&exp_cubic);
  pbVar22 = pbVar22 + 1;
  goto LAB_0013214b;
LAB_001321b7:
  lVar18 = (lVar18 - lVar10) + 1;
  goto LAB_0013217f;
}

Assistant:

void parse_feature_tweaks(options_i& options, vw& all)
{
  string hash_function("strings");
  uint32_t new_bits;
  vector<string> spelling_ns;
  vector<string> quadratics;
  vector<string> cubics;
  vector<string> interactions;
  vector<string> ignores;
  vector<string> ignore_linears;
  vector<string> keeps;
  vector<string> redefines;
  vector<string> dictionary_nses;

  vector<string> dictionary_path;

  bool noconstant;
  bool leave_duplicate_interactions;
  std::string affix;
  std::string q_colon;

  option_group_definition feature_options("Feature options");
  feature_options
      .add(make_option("hash", hash_function).keep().help("how to hash the features. Available options: strings, all"))
      .add(make_option("hash_seed", all.hash_seed).keep().default_value(0).help("seed for hash function"))
      .add(make_option("ignore", ignores).keep().help("ignore namespaces beginning with character <arg>"))
      .add(make_option("ignore_linear", ignore_linears)
               .keep()
               .help("ignore namespaces beginning with character <arg> for linear terms only"))
      .add(make_option("keep", keeps).keep().help("keep namespaces beginning with character <arg>"))
      .add(make_option("redefine", redefines)
               .keep()
               .help("redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form "
                     "'N:=S' where := is operator. Empty N or S are treated as default namespace. Use ':' as a "
                     "wildcard in S.")
               .keep())
      .add(make_option("bit_precision", new_bits).short_name("b").help("number of bits in the feature table"))
      .add(make_option("noconstant", noconstant).help("Don't add a constant feature"))
      .add(make_option("constant", all.initial_constant).short_name("C").help("Set initial value of constant"))
      .add(make_option("ngram", all.ngram_strings)
               .help("Generate N grams. To generate N grams for a single namespace 'foo', arg should be fN."))
      .add(make_option("skips", all.skip_strings)
               .help("Generate skips in N grams. This in conjunction with the ngram tag can be used to generate "
                     "generalized n-skip-k-gram. To generate n-skips for a single namespace 'foo', arg should be fN."))
      .add(make_option("feature_limit", all.limit_strings)
               .help("limit to N features. To apply to a single namespace 'foo', arg should be fN"))
      .add(make_option("affix", affix)
               .keep()
               .help("generate prefixes/suffixes of features; argument '+2a,-3b,+1' means generate 2-char prefixes for "
                     "namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"))
      .add(make_option("spelling", spelling_ns)
               .keep()
               .help("compute spelling features for a give namespace (use '_' for default namespace)"))
      .add(make_option("dictionary", dictionary_nses)
               .keep()
               .help("read a dictionary for additional features (arg either 'x:file' or just 'file')"))
      .add(make_option("dictionary_path", dictionary_path)
               .help("look in this directory for dictionaries; defaults to current directory or env{PATH}"))
      .add(make_option("interactions", interactions)
               .keep()
               .help("Create feature interactions of any level between namespaces."))
      .add(make_option("permutations", all.permutations)
               .help("Use permutations instead of combinations for feature interactions of same namespace."))
      .add(make_option("leave_duplicate_interactions", leave_duplicate_interactions)
               .help("Don't remove interactions with duplicate combinations of namespaces. For ex. this is a "
                     "duplicate: '-q ab -q ba' and a lot more in '-q ::'."))
      .add(make_option("quadratic", quadratics).short_name("q").keep().help("Create and use quadratic features"))
      // TODO this option is unused - remove?
      .add(make_option("q:", q_colon).help(": corresponds to a wildcard for all printable characters"))
      .add(make_option("cubic", cubics).keep().help("Create and use cubic features"));
  options.add_and_parse(feature_options);

  // feature manipulation
  all.p->hasher = getHasher(hash_function);

  if (options.was_supplied("spelling"))
  {
    for (size_t id = 0; id < spelling_ns.size(); id++)
    {
      spelling_ns[id] = spoof_hex_encoded_namespaces(spelling_ns[id]);
      if (spelling_ns[id][0] == '_')
        all.spelling_features[(unsigned char)' '] = true;
      else
        all.spelling_features[(size_t)spelling_ns[id][0]] = true;
    }
  }

  if (options.was_supplied("affix"))
    parse_affix_argument(all, spoof_hex_encoded_namespaces(affix));

  if (options.was_supplied("ngram"))
  {
    if (options.was_supplied("sort_features"))
      THROW("ngram is incompatible with sort_features.");

    for (size_t i = 0; i < all.ngram_strings.size(); i++)
      all.ngram_strings[i] = spoof_hex_encoded_namespaces(all.ngram_strings[i]);
    compile_gram(all.ngram_strings, all.ngram, (char*)"grams", all.quiet);
  }

  if (options.was_supplied("skips"))
  {
    if (!options.was_supplied("ngram"))
      THROW("You can not skip unless ngram is > 1");

    for (size_t i = 0; i < all.skip_strings.size(); i++)
      all.skip_strings[i] = spoof_hex_encoded_namespaces(all.skip_strings[i]);
    compile_gram(all.skip_strings, all.skips, (char*)"skips", all.quiet);
  }

  if (options.was_supplied("feature_limit"))
    compile_limits(all.limit_strings, all.limit, all.quiet);

  if (options.was_supplied("bit_precision"))
  {
    if (all.default_bits == false && new_bits != all.num_bits)
      THROW("Number of bits is set to " << new_bits << " and " << all.num_bits
                                        << " by argument and model.  That does not work.");

    all.default_bits = false;
    all.num_bits = new_bits;

    VW::validate_num_bits(all);
  }

  // prepare namespace interactions
  std::vector<std::string> expanded_interactions;

  if ( ( ((!all.pairs.empty() || !all.triples.empty() || !all.interactions.empty()) && /*data was restored from old model file directly to v_array and will be overriden automatically*/
          (options.was_supplied("quadratic") || options.was_supplied("cubic") || options.was_supplied("interactions")) ) )
       ||
       interactions_settings_doubled /*settings were restored from model file to file_options and overriden by params from command line*/)
  {
    all.trace_message << "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they'll be "
                         "OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                      << endl;

    // in case arrays were already filled in with values from old model file - reset them
    if (!all.pairs.empty())
      all.pairs.clear();
    if (!all.triples.empty())
      all.triples.clear();
    if (!all.interactions.empty())
      all.interactions.clear();
  }

  if (options.was_supplied("quadratic"))
  {
    if (!all.quiet)
      all.trace_message << "creating quadratic features for pairs: ";

    for (vector<string>::iterator i = quadratics.begin(); i != quadratics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    expanded_interactions =
        INTERACTIONS::expand_interactions(quadratics, 2, "error, quadratic features must involve two sets.");

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("cubic"))
  {
    if (!all.quiet)
      all.trace_message << "creating cubic features for triples: ";
    for (vector<string>::iterator i = cubics.begin(); i != cubics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_cubic =
        INTERACTIONS::expand_interactions(cubics, 3, "error, cubic features must involve three sets.");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_cubic), std::end(exp_cubic));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("interactions"))
  {
    if (!all.quiet)
      all.trace_message << "creating features for following interactions: ";
    for (vector<string>::iterator i = interactions.begin(); i != interactions.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_inter = INTERACTIONS::expand_interactions(interactions, 0, "");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_inter), std::end(exp_inter));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (expanded_interactions.size() > 0)
  {
    size_t removed_cnt;
    size_t sorted_cnt;
    INTERACTIONS::sort_and_filter_duplicate_interactions(
        expanded_interactions, !leave_duplicate_interactions, removed_cnt, sorted_cnt);

    if (removed_cnt > 0)
      all.trace_message << "WARNING: duplicate namespace interactions were found. Removed: " << removed_cnt << '.'
                        << endl
                        << "You can use --leave_duplicate_interactions to disable this behaviour." << endl;
    if (sorted_cnt > 0)
      all.trace_message << "WARNING: some interactions contain duplicate characters and their characters order has "
                           "been changed. Interactions affected: "
                        << sorted_cnt << '.' << endl;

    if (all.interactions.size() > 0)
    {
      // should be empty, but just in case...
      all.interactions.clear();
    }

    all.interactions = expanded_interactions;

    // copy interactions of size 2 and 3 to old vectors for backward compatibility
    for (auto& i : expanded_interactions)
    {
      const size_t len = i.size();
      if (len == 2)
        all.pairs.push_back(i);
      else if (len == 3)
        all.triples.push_back(i);
    }
  }

  for (size_t i = 0; i < 256; i++)
  {
    all.ignore[i] = false;
    all.ignore_linear[i] = false;
  }
  all.ignore_some = false;
  all.ignore_some_linear = false;

  if (options.was_supplied("ignore"))
  {
    all.ignore_some = true;

    for (vector<string>::iterator i = ignores.begin(); i != ignores.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring namespaces beginning with: ";
      for (auto const& ignore : ignores)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("ignore_linear"))
  {
    all.ignore_some_linear = true;

    for (vector<string>::iterator i = ignore_linears.begin(); i != ignore_linears.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++)
        all.ignore_linear[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring linear terms for namespaces beginning with: ";
      for (auto const& ignore : ignore_linears)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("keep"))
  {
    for (size_t i = 0; i < 256; i++) all.ignore[i] = true;

    all.ignore_some = true;

    for (vector<string>::iterator i = keeps.begin(); i != keeps.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = false;
    }

    if (!all.quiet)
    {
      all.trace_message << "using namespaces beginning with: ";
      for (auto const& keep : keeps)
        for (auto const character : keep) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  // --redefine param code
  all.redefine_some = false;  // false by default

  if (options.was_supplied("redefine"))
  {
    // initail values: i-th namespace is redefined to i itself
    for (size_t i = 0; i < 256; i++) all.redefine[i] = (unsigned char)i;

    // note: --redefine declaration order is matter
    // so --redefine :=L --redefine ab:=M  --ignore L  will ignore all except a and b under new M namspace

    for (vector<string>::iterator arg_iter = redefines.begin(); arg_iter != redefines.end(); arg_iter++)
    {
      string argument = spoof_hex_encoded_namespaces(*arg_iter);
      size_t arg_len = argument.length();

      size_t operator_pos = 0;  // keeps operator pos + 1 to stay unsigned type
      bool operator_found = false;
      unsigned char new_namespace = ' ';

      // let's find operator ':=' position in N:=S
      for (size_t i = 0; i < arg_len; i++)
      {
        if (operator_found)
        {
          if (i > 2)
          {
            new_namespace = argument[0];
          }  // N is not empty
          break;
        }
        else if (argument[i] == ':')
          operator_pos = i + 1;
        else if ((argument[i] == '=') && (operator_pos == i))
          operator_found = true;
      }

      if (!operator_found)
        THROW("argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");

      if (++operator_pos > 3)  // seek operator end
        all.trace_message
            << "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one ('"
            << new_namespace << "') will be used as target namespace." << endl;

      all.redefine_some = true;

      // case ':=S' doesn't require any additional code as new_namespace = ' ' by default

      if (operator_pos == arg_len)  // S is empty, default namespace shall be used
        all.redefine[(int)' '] = new_namespace;
      else
        for (size_t i = operator_pos; i < arg_len; i++)
        {
          // all namespaces from S are redefined to N
          unsigned char c = argument[i];
          if (c != ':')
            all.redefine[c] = new_namespace;
          else
          {
            // wildcard found: redefine all except default and break
            for (size_t i = 0; i < 256; i++) all.redefine[i] = new_namespace;
            break;  // break processing S
          }
        }
    }
  }

  if (options.was_supplied("dictionary"))
  {
    if (options.was_supplied("dictionary_path"))
      for (string path : dictionary_path)
        if (directory_exists(path))
          all.dictionary_path.push_back(path);
    if (directory_exists("."))
      all.dictionary_path.push_back(".");

    const std::string PATH = getenv("PATH");
#if _WIN32
    const char delimiter = ';';
#else
    const char delimiter = ':';
#endif
    if (!PATH.empty())
    {
      size_t previous = 0;
      size_t index = PATH.find(delimiter);
      while (index != string::npos)
      {
        all.dictionary_path.push_back(PATH.substr(previous, index - previous));
        previous = index + 1;
        index = PATH.find(delimiter, previous);
      }
      all.dictionary_path.push_back(PATH.substr(previous));
    }

    for (size_t id = 0; id < dictionary_nses.size(); id++) parse_dictionary_argument(all, dictionary_nses[id]);
  }

  if (noconstant)
    all.add_constant = false;
}